

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t
exr_get_tile_sizes(exr_const_context_t ctxt,int part_index,int levelx,int levely,int32_t *tilew,
                  int32_t *tileh)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  exr_const_context_t c;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  uint *in_R8;
  uint *in_R9;
  int32_t levh;
  int32_t levw;
  exr_attr_tiledesc_t *tiledesc;
  exr_const_priv_part_t part;
  exr_const_context_t in_stack_ffffffffffffffc0;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffc0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar4 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if ((*(int *)(lVar4 + 4) == 1) || (*(int *)(lVar4 + 4) == 3)) {
        if (((*(long *)(lVar4 + 0x60) == 0) ||
            (((*(int *)(lVar4 + 0xc0) < 1 || (*(int *)(lVar4 + 0xc4) < 1)) ||
             (*(long *)(lVar4 + 200) == 0)))) || (*(long *)(lVar4 + 0xd0) == 0)) {
          if (*in_RDI == '\x01') {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
          }
          local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"Tile data missing or corrupt");
        }
        else if (((in_EDX < 0) || (in_ECX < 0)) ||
                ((*(int *)(lVar4 + 0xc0) <= in_EDX || (*(int *)(lVar4 + 0xc4) <= in_ECX)))) {
          if (*in_RDI == '\x01') {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
          }
          local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,4);
        }
        else {
          c = *(exr_const_context_t *)(*(long *)(lVar4 + 0x60) + 0x18);
          if (in_R8 != (uint *)0x0) {
            uVar1 = *(uint *)(*(long *)(lVar4 + 0xd8) + (long)in_EDX * 4);
            uVar2._0_1_ = c->mode;
            uVar2._1_1_ = c->version;
            uVar2._2_1_ = c->max_name_length;
            uVar2._3_1_ = c->is_singlepart_tiled;
            if (uVar2 < uVar1) {
              *in_R8 = *(uint *)c;
            }
            else {
              *in_R8 = uVar1;
            }
          }
          if (in_R9 != (uint *)0x0) {
            uVar1 = *(uint *)(*(long *)(lVar4 + 0xe0) + (long)in_ECX * 4);
            uVar3._0_1_ = c->has_nonimage_data;
            uVar3._1_1_ = c->is_multipart;
            uVar3._2_1_ = c->strict_header;
            uVar3._3_1_ = c->silent_header;
            if (uVar3 < uVar1) {
              *in_R9 = *(uint *)&c->has_nonimage_data;
            }
            else {
              *in_R9 = uVar1;
            }
          }
          if (*in_RDI == '\x01') {
            internal_exr_unlock(c);
          }
          local_4 = 0;
        }
      }
      else {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_stack_ffffffffffffffc0);
        }
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x13);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_tile_sizes (
    exr_const_context_t ctxt,
    int                 part_index,
    int                 levelx,
    int                 levely,
    int32_t*            tilew,
    int32_t*            tileh)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* tiledesc;

        if (!part->tiles || part->num_tile_levels_x <= 0 ||
            part->num_tile_levels_y <= 0 || !part->tile_level_tile_count_x ||
            !part->tile_level_tile_count_y)
        {
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Tile data missing or corrupt"));
        }

        if (levelx < 0 || levely < 0 || levelx >= part->num_tile_levels_x ||
            levely >= part->num_tile_levels_y)
            return EXR_UNLOCK_WRITE_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_ARGUMENT_OUT_OF_RANGE));

        tiledesc = part->tiles->tiledesc;
        if (tilew)
        {
            int32_t levw = part->tile_level_tile_size_x[levelx];
            if (tiledesc->x_size < (uint32_t) levw)
                *tilew = (int32_t) tiledesc->x_size;
            else
                *tilew = levw;
        }
        if (tileh)
        {
            int32_t levh = part->tile_level_tile_size_y[levely];
            if (tiledesc->y_size < (uint32_t) levh)
                *tileh = (int32_t) tiledesc->y_size;
            else
                *tileh = levh;
        }
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }

    return EXR_UNLOCK_WRITE_AND_RETURN (
        ctxt->standard_error (ctxt, EXR_ERR_TILE_SCAN_MIXEDAPI));
}